

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_add(sexp ctx,sexp a,sexp b)

{
  sexp b_00;
  sexp psVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  sexp tmp;
  double local_30;
  sexp local_28;
  sexp_gc_var_t local_20;
  
  if (((ulong)a & 3) == 0) {
    uVar3 = 0;
    if ((ulong)a->tag < 0x11) {
      uVar3 = sexp_number_types[a->tag];
    }
  }
  else {
    uVar3 = (uint)a & 1;
  }
  if (((ulong)b & 3) == 0) {
    uVar5 = 0;
    if ((ulong)b->tag < 0x11) {
      uVar5 = sexp_number_types[b->tag];
    }
  }
  else {
    uVar5 = (uint)b & 1;
  }
  local_20.var = &local_28;
  local_28 = (sexp)&DAT_0000043e;
  local_20.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_20;
  psVar1 = a;
  b_00 = b;
  uVar4 = uVar3;
  if ((int)uVar3 <= (int)uVar5) {
    psVar1 = (sexp)&DAT_0000043e;
    b_00 = a;
    a = b;
    uVar4 = uVar5;
    uVar5 = uVar3;
  }
  uVar4 = uVar4 + uVar5 * 6;
  if (0x23 < uVar4) goto switchD_0011ade1_caseD_6;
  switch(uVar4) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
    psVar1 = sexp_type_exception(ctx,(sexp)0x0,3,b_00);
    break;
  case 7:
    lVar2 = ((long)a >> 1) + ((long)b_00 >> 1);
    if (lVar2 + -0x4000000000000000 < 0) {
      psVar1 = (sexp)(lVar2 * 2 + 1);
    }
    else {
      local_28 = sexp_fixnum_to_bignum(ctx,b_00);
      psVar1 = sexp_add(ctx,local_28,a);
    }
    break;
  case 8:
    psVar1 = a;
    if (b_00 == (sexp)&DAT_00000001) break;
    dVar6 = (double)((long)b_00 >> 1);
    goto LAB_0011aecf;
  case 9:
    psVar1 = sexp_bignum_add_fixnum(ctx,a,b_00);
    goto LAB_0011aee4;
  case 10:
  case 0x16:
    b_00 = sexp_make_ratio(ctx,b_00,(sexp)&DAT_00000003);
    local_28 = b_00;
  case 0x1c:
    psVar1 = sexp_ratio_add(ctx,b_00,a);
    break;
  case 0xb:
  case 0x11:
  case 0x17:
  case 0x1d:
    b_00 = sexp_make_complex(ctx,b_00,(sexp)&DAT_00000001);
    local_28 = b_00;
  case 0x23:
    psVar1 = sexp_complex_add(ctx,b_00,a);
    break;
  case 0xe:
    dVar6 = (b_00->value).flonum;
LAB_0011aecf:
    dVar6 = dVar6 + (a->value).flonum;
LAB_0011af07:
    psVar1 = sexp_make_flonum(ctx,dVar6);
    break;
  case 0xf:
    local_30 = (b_00->value).flonum;
    dVar6 = sexp_bignum_to_double(a);
    goto LAB_0011af01;
  case 0x10:
    local_30 = (b_00->value).flonum;
    dVar6 = sexp_ratio_to_double(ctx,a);
LAB_0011af01:
    dVar6 = dVar6 + local_30;
    goto LAB_0011af07;
  case 0x15:
    psVar1 = sexp_bignum_add(ctx,(sexp)0x0,a,b_00);
LAB_0011aee4:
    psVar1 = sexp_bignum_normalize(psVar1);
  }
switchD_0011ade1_caseD_6:
  (ctx->value).context.saves = local_20.next;
  return psVar1;
}

Assistant:

sexp sexp_add (sexp ctx, sexp a, sexp b) {
  sexp_sint_t sum;
  int at=sexp_number_type(a), bt=sexp_number_type(b), t;
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {r=a; a=b; b=r; t=at; at=bt; bt=t;}
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_NOT_CPX:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_FIX:
    sum = sexp_unbox_fixnum(a) + sexp_unbox_fixnum(b);
    if ((sum < SEXP_MIN_FIXNUM) || (sum > SEXP_MAX_FIXNUM))
      r = sexp_add(ctx, tmp=sexp_fixnum_to_bignum(ctx, a), b);
    else
      r = sexp_make_fixnum(sum);
    break;
  case SEXP_NUM_FIX_FLO:
    r = a == SEXP_ZERO ? b : sexp_make_flonum(ctx, sexp_fixnum_to_double(a)+sexp_flonum_value(b));
    break;
  case SEXP_NUM_FIX_BIG:
    r = sexp_bignum_normalize(sexp_bignum_add_fixnum(ctx, b, a));
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_add(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) + sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_add(ctx, NULL, b, a));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) + sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    r = sexp_ratio_add(ctx, a, b);
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
#endif
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    a = tmp = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
    r = sexp_complex_add(ctx, a, b);
    break;
#endif
  }
  sexp_gc_release1(ctx);
  return r;
}